

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O0

int taylor_check<double,2,2>(char *label,taylor<double,_2,_2> *t,num_t *correct,num_t thres)

{
  double dVar1;
  ostream *poVar2;
  double *pdVar3;
  int __x;
  taylor<double,_2,_2> *ptVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [32];
  ostringstream local_428 [8];
  ostringstream errmsg;
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [55];
  allocator local_1d1;
  string local_1d0 [32];
  ostringstream local_1b0 [8];
  ostringstream message;
  double err;
  int i;
  int nfail;
  num_t thres_local;
  num_t *correct_local;
  taylor<double,_2,_2> *t_local;
  char *label_local;
  
  err._4_4_ = 0;
  for (err._0_4_ = 0; err._0_4_ < 6; err._0_4_ = err._0_4_ + 1) {
    ptVar4 = t;
    taylor<double,_2,_2>::operator[](t,err._0_4_);
    __x = (int)ptVar4;
    std::abs(__x);
    std::abs(__x);
    if (thres < (extraout_XMM0_Qa * 2.0) / (extraout_XMM0_Qa_00 + 1.0)) {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Error in coefficient ",&local_1d1);
      poVar2 = std::operator<<((ostream *)local_1b0,local_1d0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,err._0_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208," of ",&local_209);
      poVar2 = std::operator<<(poVar2,local_208);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,label,&local_231);
      poVar2 = std::operator<<(poVar2,local_230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,". Correct:",&local_259);
      poVar2 = std::operator<<(poVar2,local_258);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,correct[err._0_4_]);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,", taylor:",&local_281);
      poVar2 = std::operator<<(poVar2,local_280);
      pdVar3 = taylor<double,_2,_2>::operator[](t,err._0_4_);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8," error: ",&local_2a9);
      poVar2 = std::operator<<(poVar2,local_2a8);
      dVar1 = correct[err._0_4_];
      pdVar3 = taylor<double,_2,_2>::operator[](t,err._0_4_);
      std::ostream::operator<<(poVar2,dVar1 - *pdVar3);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::__cxx11::ostringstream::ostringstream(local_428);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,"Taylor fatal error.\n",&local_449);
      poVar2 = std::operator<<((ostream *)local_428,local_448);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_470," In function ",&local_471);
      poVar2 = std::operator<<(poVar2,local_470);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_498,"taylor_check",&local_499);
      poVar2 = std::operator<<(poVar2,local_498);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c0," at line ",&local_4c1);
      poVar2 = std::operator<<(poVar2,local_4c0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x87);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e8," of file ",&local_4e9);
      poVar2 = std::operator<<(poVar2,local_4e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_510,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/tests/unittest_taylor.cpp"
                 ,&local_511);
      poVar2 = std::operator<<(poVar2,local_510);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      std::__cxx11::string::~string(local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      std::__cxx11::string::~string(local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
      std::__cxx11::ostringstream::str();
      message_and_die(local_538,(ostringstream *)local_1b0);
      std::__cxx11::string::~string((string *)local_538);
      std::__cxx11::ostringstream::~ostringstream(local_428);
      err._4_4_ = err._4_4_ + 1;
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
  }
  return err._4_4_;
}

Assistant:

int taylor_check(const char * label,
                 const taylor<T, Nvar, Ndeg> & t,
                 const num_t correct[],
                 num_t thres) {
  int nfail = 0;
  for (int i = 0; i < NR_COEFF_CHECK; i++) {
    T err = 2 * std::abs(t[i] - correct[i]) / (1 + std::abs(correct[i]));
    if (err > thres) {
      std::ostringstream message;
      message << std::string("Error in coefficient ") << i << std::string(" of ")
              << std::string(label) << std::string(". Correct:") << correct[i]
              << std::string(", taylor:") << t[i] << std::string(" error: ")
              << correct[i] - t[i];
      TAYLOR_ERROR(message);
      nfail++;
    }
  }
  return nfail;
}